

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O2

size_t ZSTD_initCStream_advanced
                 (ZSTD_CStream *zcs,void *dict,size_t dictSize,ZSTD_parameters params,
                 unsigned_long_long pledgedSrcSize)

{
  undefined8 uVar1;
  ZSTD_CCtx_params params_00;
  size_t sVar2;
  long lVar3;
  ZSTD_CCtx_params *pZVar4;
  undefined8 *puVar5;
  ulong pledgedSrcSize_00;
  byte bVar6;
  undefined8 uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  undefined8 uVar11;
  undefined1 auVar12 [12];
  undefined1 auVar13 [24];
  undefined1 in_stack_ffffffffffffff54 [100];
  undefined1 auVar14 [24];
  
  bVar6 = 0;
  uVar10 = params.cParams.minMatch;
  uVar7 = params.cParams._0_8_;
  uVar8 = params.cParams.hashLog;
  uVar9 = params.cParams.searchLog;
  uVar11 = params.cParams._20_8_;
  sVar2 = ZSTD_checkCParams(params.cParams);
  if (sVar2 < 0xffffffffffffff89) {
    pledgedSrcSize_00 = -(ulong)(params.fParams.contentSizeFlag == 0) | pledgedSrcSize;
    if (pledgedSrcSize != 0) {
      pledgedSrcSize_00 = pledgedSrcSize;
    }
    uVar1 = params.fParams._0_8_;
    (zcs->requestedParams).format = (zcs->requestedParams).format;
    (zcs->requestedParams).cParams.windowLog = params.cParams.windowLog;
    (zcs->requestedParams).cParams.chainLog = (int)params.cParams._4_8_;
    (zcs->requestedParams).cParams.hashLog = (int)((ulong)params.cParams._4_8_ >> 0x20);
    (zcs->requestedParams).cParams.searchLog = (int)params.cParams._12_8_;
    (zcs->requestedParams).cParams.minMatch = (int)((ulong)params.cParams._12_8_ >> 0x20);
    (zcs->requestedParams).cParams.targetLength = params.cParams.targetLength;
    (zcs->requestedParams).cParams.strategy = params.cParams.strategy;
    (zcs->requestedParams).fParams.contentSizeFlag = (int)uVar1;
    (zcs->requestedParams).fParams.checksumFlag = (int)((ulong)uVar1 >> 0x20);
    (zcs->requestedParams).fParams.noDictIDFlag = params.fParams.noDictIDFlag;
    (zcs->requestedParams).compressionLevel = 3;
    pZVar4 = &zcs->requestedParams;
    puVar5 = (undefined8 *)&stack0xffffffffffffff38;
    for (lVar3 = 0x10; lVar3 != 0; lVar3 = lVar3 + -1) {
      *puVar5 = *(undefined8 *)pZVar4;
      pZVar4 = (ZSTD_CCtx_params *)((long)pZVar4 + (ulong)bVar6 * -0x10 + 8);
      puVar5 = puVar5 + (ulong)bVar6 * -2 + 1;
    }
    params_00.cParams.chainLog = uVar8;
    params_00.format = (int)uVar7;
    params_00.cParams.windowLog = (int)((ulong)uVar7 >> 0x20);
    params_00.cParams.hashLog = uVar9;
    params_00.cParams.searchLog = uVar10;
    params_00.cParams.minMatch = (uint)uVar11;
    params_00.cParams.targetLength = SUB84(uVar11,4);
    auVar12 = in_stack_ffffffffffffff54._4_12_;
    auVar13 = in_stack_ffffffffffffff54._52_24_;
    auVar14 = in_stack_ffffffffffffff54._76_24_;
    params_00.cParams.strategy = in_stack_ffffffffffffff54._0_4_;
    params_00.fParams.contentSizeFlag = auVar12._0_4_;
    params_00.fParams.checksumFlag = auVar12._4_4_;
    params_00.fParams.noDictIDFlag = auVar12._8_4_;
    params_00.compressionLevel = in_stack_ffffffffffffff54._16_4_;
    params_00.forceWindow = in_stack_ffffffffffffff54._20_4_;
    params_00.attachDictPref = in_stack_ffffffffffffff54._24_4_;
    params_00.nbWorkers = in_stack_ffffffffffffff54._28_4_;
    params_00._60_4_ = in_stack_ffffffffffffff54._32_4_;
    params_00.jobSize = in_stack_ffffffffffffff54._36_8_;
    params_00.overlapLog = in_stack_ffffffffffffff54._44_4_;
    params_00.rsyncable = in_stack_ffffffffffffff54._48_4_;
    params_00.ldmParams.enableLdm = auVar13._0_4_;
    params_00.ldmParams.hashLog = auVar13._4_4_;
    params_00.ldmParams.bucketSizeLog = auVar13._8_4_;
    params_00.ldmParams.minMatchLength = auVar13._12_4_;
    params_00.ldmParams.hashRateLog = auVar13._16_4_;
    params_00.ldmParams.windowLog = auVar13._20_4_;
    params_00.customMem.customAlloc = (ZSTD_allocFunction)auVar14._0_8_;
    params_00.customMem.customFree = (ZSTD_freeFunction)auVar14._8_8_;
    params_00.customMem.opaque = (void *)auVar14._16_8_;
    sVar2 = ZSTD_initCStream_internal
                      (zcs,dict,dictSize,(ZSTD_CDict *)0x0,params_00,pledgedSrcSize_00);
  }
  return sVar2;
}

Assistant:

size_t ZSTD_initCStream_advanced(ZSTD_CStream* zcs,
                                 const void* dict, size_t dictSize,
                                 ZSTD_parameters params, unsigned long long pledgedSrcSize)
{
    DEBUGLOG(4, "ZSTD_initCStream_advanced: pledgedSrcSize=%u, flag=%u",
                (unsigned)pledgedSrcSize, params.fParams.contentSizeFlag);
    CHECK_F( ZSTD_checkCParams(params.cParams) );
    if ((pledgedSrcSize==0) && (params.fParams.contentSizeFlag==0)) pledgedSrcSize = ZSTD_CONTENTSIZE_UNKNOWN;  /* for compatibility with older programs relying on this behavior. Users should now specify ZSTD_CONTENTSIZE_UNKNOWN. This line will be removed in the future. */
    zcs->requestedParams = ZSTD_assignParamsToCCtxParams(zcs->requestedParams, params);
    return ZSTD_initCStream_internal(zcs, dict, dictSize, NULL /*cdict*/, zcs->requestedParams, pledgedSrcSize);
}